

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegdec.c
# Opt level: O0

int ReadJPEG(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  void *pvVar1;
  int iVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  JPEGReadContext ctx;
  JSAMPROW buffer [1];
  uint8_t *rgb;
  my_error_mgr jerr;
  jpeg_decompress_struct dinfo;
  int64_t stride;
  int height;
  int width;
  int ok;
  uint8_t *in_stack_fffffffffffffb58;
  j_decompress_ptr in_stack_fffffffffffffb60;
  Metadata *in_stack_fffffffffffffb80;
  j_decompress_ptr in_stack_fffffffffffffb88;
  void *local_458;
  void *local_450;
  code *local_448 [21];
  __jmp_buf_tag _Stack_3a0;
  jpeg_decompress_struct local_2d8;
  uint64_t local_48;
  uint local_3c;
  uint local_38;
  int local_34;
  long local_30;
  long local_20;
  
  local_34 = 0;
  local_450 = (void *)0x0;
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == 0)) {
    return 0;
  }
  local_30 = in_R8;
  local_20 = in_RDX;
  memset(&stack0xfffffffffffffb60,0,0x48);
  memset(&local_2d8,0,0x290);
  local_2d8.err = (jpeg_error_mgr *)jpeg_std_error(local_448);
  local_448[0] = my_error_exit;
  iVar2 = _setjmp(&_Stack_3a0);
  if (iVar2 == 0) {
    jpeg_CreateDecompress(&local_2d8,0x50,0x290);
    ContextSetup(&local_2d8,(JPEGReadContext *)&stack0xfffffffffffffb60);
    if (local_30 != 0) {
      SaveMetadataMarkers(in_stack_fffffffffffffb60);
    }
    jpeg_read_header(&local_2d8,1);
    local_2d8.out_color_space = JCS_RGB;
    local_2d8.do_fancy_upsampling = 1;
    jpeg_start_decompress(&local_2d8);
    if (local_2d8.output_components == 3) {
      local_38 = local_2d8.output_width;
      local_3c = local_2d8.output_height;
      local_48 = (ulong)local_2d8.output_width * 3;
      if (((local_48 == (long)(int)local_48) &&
          (iVar2 = ImgIoUtilCheckSizeArgumentsOverflow(local_48,(long)(int)local_2d8.output_height),
          iVar2 != 0)) &&
         (local_450 = malloc(local_48 * (long)(int)local_3c), pvVar1 = local_450,
         local_450 != (void *)0x0)) {
        while (local_458 = pvVar1, local_2d8.output_scanline < local_2d8.output_height) {
          iVar2 = jpeg_read_scanlines(&local_2d8,&local_458,1);
          if (iVar2 != 1) goto LAB_00105d08;
          pvVar1 = (void *)(local_48 + (long)local_458);
        }
        if ((local_30 == 0) ||
           (local_34 = ExtractMetadataFromJPEG(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80),
           local_34 != 0)) {
          jpeg_finish_decompress(&local_2d8);
          jpeg_destroy_decompress(&local_2d8);
          *(uint *)(local_20 + 8) = local_38;
          *(uint *)(local_20 + 0xc) = local_3c;
          local_34 = WebPPictureImportRGB
                               ((WebPPicture *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,0
                               );
          if (local_34 != 0) goto LAB_00105f69;
        }
        else {
          fprintf(_stderr,"Error extracting JPEG metadata!\n");
        }
      }
    }
  }
LAB_00105d08:
  MetadataFree((Metadata *)0x105d15);
  jpeg_destroy_decompress(&local_2d8);
LAB_00105f69:
  free(local_450);
  return local_34;
}

Assistant:

int ReadJPEG(const uint8_t* const data, size_t data_size,
             WebPPicture* const pic, int keep_alpha,
             Metadata* const metadata) {
  volatile int ok = 0;
  int width, height;
  int64_t stride;
  volatile struct jpeg_decompress_struct dinfo;
  struct my_error_mgr jerr;
  uint8_t* volatile rgb = NULL;
  JSAMPROW buffer[1];
  JPEGReadContext ctx;

  if (data == NULL || data_size == 0 || pic == NULL) return 0;

  (void)keep_alpha;
  memset(&ctx, 0, sizeof(ctx));
  ctx.data = data;
  ctx.data_size = data_size;

  memset((j_decompress_ptr)&dinfo, 0, sizeof(dinfo));   // for setjmp safety
  dinfo.err = jpeg_std_error(&jerr.pub);
  jerr.pub.error_exit = my_error_exit;

  if (setjmp(jerr.setjmp_buffer)) {
 Error:
    MetadataFree(metadata);
    jpeg_destroy_decompress((j_decompress_ptr)&dinfo);
    goto End;
  }

  jpeg_create_decompress((j_decompress_ptr)&dinfo);
  ContextSetup(&dinfo, &ctx);
  if (metadata != NULL) SaveMetadataMarkers((j_decompress_ptr)&dinfo);
  jpeg_read_header((j_decompress_ptr)&dinfo, TRUE);

  dinfo.out_color_space = JCS_RGB;
  dinfo.do_fancy_upsampling = TRUE;

  jpeg_start_decompress((j_decompress_ptr)&dinfo);

  if (dinfo.output_components != 3) {
    goto Error;
  }

  width = dinfo.output_width;
  height = dinfo.output_height;
  stride = (int64_t)dinfo.output_width * dinfo.output_components * sizeof(*rgb);

  if (stride != (int)stride ||
      !ImgIoUtilCheckSizeArgumentsOverflow(stride, height)) {
    goto Error;
  }

  rgb = (uint8_t*)malloc((size_t)stride * height);
  if (rgb == NULL) {
    goto Error;
  }
  buffer[0] = (JSAMPLE*)rgb;

  while (dinfo.output_scanline < dinfo.output_height) {
    if (jpeg_read_scanlines((j_decompress_ptr)&dinfo, buffer, 1) != 1) {
      goto Error;
    }
    buffer[0] += stride;
  }

  if (metadata != NULL) {
    ok = ExtractMetadataFromJPEG((j_decompress_ptr)&dinfo, metadata);
    if (!ok) {
      fprintf(stderr, "Error extracting JPEG metadata!\n");
      goto Error;
    }
  }

  jpeg_finish_decompress((j_decompress_ptr)&dinfo);
  jpeg_destroy_decompress((j_decompress_ptr)&dinfo);

  // WebP conversion.
  pic->width = width;
  pic->height = height;
  ok = WebPPictureImportRGB(pic, rgb, (int)stride);
  if (!ok) goto Error;

 End:
  free(rgb);
  return ok;
}